

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O2

void QtPrivate::
     q_relocate_overlap_n_left_move<std::reverse_iterator<std::pair<QHttpNetworkRequest,QHttpNetworkReply*>*>,long_long>
               (reverse_iterator<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_*> first,
               longlong n,
               reverse_iterator<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_*> d_first)

{
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *this;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *ppVar1;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *ppVar2;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *ppVar3;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *ppVar4;
  long in_FS_OFFSET;
  Destructor local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ppVar1 = (pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)
           ((d_first.current)->first).super_QHttpNetworkHeader._vptr_QHttpNetworkHeader;
  ppVar2 = ppVar1 + -n;
  ppVar4 = (pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)
           ((first.current)->first).super_QHttpNetworkHeader._vptr_QHttpNetworkHeader;
  this = ppVar4;
  local_50.end.current = ppVar1;
  ppVar3 = ppVar2;
  if (ppVar2 < ppVar4) {
    ppVar3 = ppVar4;
  }
  while (local_50.iter = &local_50.intermediate, local_50.intermediate.current = ppVar1,
        ppVar1 != ppVar3) {
    std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>::pair(ppVar1 + -1,this + -1);
    ((d_first.current)->first).super_QHttpNetworkHeader._vptr_QHttpNetworkHeader =
         ((d_first.current)->first).super_QHttpNetworkHeader._vptr_QHttpNetworkHeader + -3;
    this = (pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)
           (((first.current)->first).super_QHttpNetworkHeader._vptr_QHttpNetworkHeader + -3);
    ((first.current)->first).super_QHttpNetworkHeader._vptr_QHttpNetworkHeader = (_func_int **)this;
    ppVar1 = (pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)
             ((d_first.current)->first).super_QHttpNetworkHeader._vptr_QHttpNetworkHeader;
  }
  while (ppVar1 != ppVar2) {
    std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>::operator=(ppVar1 + -1,this + -1);
    ((d_first.current)->first).super_QHttpNetworkHeader._vptr_QHttpNetworkHeader =
         ((d_first.current)->first).super_QHttpNetworkHeader._vptr_QHttpNetworkHeader + -3;
    this = (pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)
           (((first.current)->first).super_QHttpNetworkHeader._vptr_QHttpNetworkHeader + -3);
    ((first.current)->first).super_QHttpNetworkHeader._vptr_QHttpNetworkHeader = (_func_int **)this;
    ppVar1 = (pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)
             ((d_first.current)->first).super_QHttpNetworkHeader._vptr_QHttpNetworkHeader;
  }
  if (ppVar2 < ppVar4) {
    ppVar4 = ppVar2;
  }
  local_50.iter = &local_50.end;
  while (this != ppVar4) {
    ((first.current)->first).super_QHttpNetworkHeader._vptr_QHttpNetworkHeader =
         (_func_int **)(this + 1);
    QHttpNetworkRequest::~QHttpNetworkRequest(&this->first);
    this = (pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)
           ((first.current)->first).super_QHttpNetworkHeader._vptr_QHttpNetworkHeader;
  }
  q_relocate_overlap_n_left_move<std::reverse_iterator<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_*>,_long_long>
  ::Destructor::~Destructor(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}